

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraCommands.cpp
# Opt level: O3

ResponseLine * __thiscall
DebugInfoGenericCommand::trigger(DebugInfoGenericCommand *this,string_view parameters)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  User *pUVar6;
  char cVar7;
  uint uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  ResponseLine *pRVar10;
  undefined8 uVar11;
  long lVar12;
  undefined8 *puVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined1 auVar16 [16];
  char local_149;
  ResponseLine *local_148;
  ResponseLine *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined8 *local_110;
  User *local_108;
  undefined8 *local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  string local_d0;
  string local_b0;
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  if ((IRCCommand::selected_server == 0) && (IRCCommand::active_server == 0)) {
    local_140 = (ResponseLine *)operator_new(0x30);
    Jupiter::GenericCommand::ResponseLine::ResponseLine
              (local_140,0x2b,"Error: No IRC server is currently selected.",2);
  }
  else {
    local_140 = (ResponseLine *)operator_new(0x30);
    auVar16 = Jupiter::IRC::Client::getPrefixes();
    paVar1 = &local_130.field_2;
    local_130.field_2._M_allocated_capacity._0_6_ = 0x786966657250;
    local_130.field_2._M_allocated_capacity._6_2_ = 0x7365;
    local_130.field_2._8_2_ = 0x203a;
    local_130._M_string_length = 10;
    local_130.field_2._10_4_ = local_130.field_2._10_4_ & 0xffffff00;
    local_130._M_dataplus._M_p = (pointer)paVar1;
    pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_130,auVar16._8_8_,auVar16._0_8_);
    pcVar2 = (pbVar9->_M_dataplus)._M_p;
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,pcVar2,pcVar2 + pbVar9->_M_string_length);
    Jupiter::GenericCommand::ResponseLine::ResponseLine(local_140,local_70,0);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar1) {
      operator_delete(local_130._M_dataplus._M_p,
                      CONCAT26(local_130.field_2._M_allocated_capacity._6_2_,
                               local_130.field_2._M_allocated_capacity._0_6_) + 1);
    }
    pRVar10 = (ResponseLine *)operator_new(0x30);
    auVar16 = Jupiter::IRC::Client::getPrefixModes();
    local_130.field_2._M_allocated_capacity._0_6_ = 0x786966657250;
    local_130.field_2._M_allocated_capacity._6_2_ = 0x4d20;
    local_130.field_2._8_2_ = 0x646f;
    local_130.field_2._10_4_ = 0x203a7365;
    local_130._M_string_length = 0xe;
    local_130.field_2._M_local_buf[0xe] = '\0';
    local_130._M_dataplus._M_p = (pointer)paVar1;
    pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_130,auVar16._8_8_,auVar16._0_8_);
    pcVar2 = (pbVar9->_M_dataplus)._M_p;
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,pcVar2,pcVar2 + pbVar9->_M_string_length);
    Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar10,local_90,0);
    if (local_90[0] != local_80) {
      operator_delete(local_90[0],local_80[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar1) {
      operator_delete(local_130._M_dataplus._M_p,
                      CONCAT26(local_130.field_2._M_allocated_capacity._6_2_,
                               local_130.field_2._M_allocated_capacity._0_6_) + 1);
    }
    *(ResponseLine **)(local_140 + 0x28) = pRVar10;
    local_148 = (ResponseLine *)operator_new(0x30);
    uVar11 = Jupiter::IRC::Client::getChannelCount();
    string_printf_abi_cxx11_(&local_50,"Outputting data for %u channels...",uVar11);
    Jupiter::GenericCommand::ResponseLine::ResponseLine(local_148,&local_50,0);
    *(ResponseLine **)(pRVar10 + 0x28) = local_148;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      local_148 = *(ResponseLine **)(pRVar10 + 0x28);
    }
    lVar12 = Jupiter::IRC::Client::getChannels_abi_cxx11_();
    for (local_110 = *(undefined8 **)(lVar12 + 0x10); local_110 != (undefined8 *)0x0;
        local_110 = (undefined8 *)*local_110) {
      pUVar6 = (User *)(local_110 + 5);
      pRVar10 = (ResponseLine *)operator_new(0x30);
      uVar11 = Jupiter::IRC::Client::Channel::getName();
      Jupiter::IRC::Client::Channel::getName();
      uVar8 = Jupiter::IRC::Client::Channel::getType();
      string_printf_abi_cxx11_(&local_b0,"Channel %.*s - Type: %d",uVar11,extraout_RDX,(ulong)uVar8)
      ;
      Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar10,&local_b0,0);
      *(ResponseLine **)(local_148 + 0x28) = pRVar10;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        pRVar10 = *(ResponseLine **)(local_148 + 0x28);
      }
      lVar12 = Jupiter::IRC::Client::Channel::getUsers_abi_cxx11_();
      puVar3 = *(undefined8 **)(lVar12 + 0x10);
      local_148 = pRVar10;
      while (local_108 = pUVar6, puVar3 != (undefined8 *)0x0) {
        Jupiter::IRC::Client::Channel::User::getUser();
        pRVar10 = (ResponseLine *)operator_new(0x30);
        lVar12 = Jupiter::IRC::Client::User::getNickname_abi_cxx11_();
        uVar11 = *(undefined8 *)(lVar12 + 8);
        puVar13 = (undefined8 *)Jupiter::IRC::Client::User::getNickname_abi_cxx11_();
        uVar4 = *puVar13;
        lVar12 = Jupiter::IRC::Client::User::getUsername_abi_cxx11_();
        uVar5 = *(undefined8 *)(lVar12 + 8);
        puVar13 = (undefined8 *)Jupiter::IRC::Client::User::getUsername_abi_cxx11_();
        local_d8 = *puVar13;
        lVar12 = Jupiter::IRC::Client::User::getHostname_abi_cxx11_();
        local_e0 = *(undefined8 *)(lVar12 + 8);
        puVar13 = (undefined8 *)Jupiter::IRC::Client::User::getHostname_abi_cxx11_();
        local_e8 = *puVar13;
        cVar7 = Jupiter::IRC::Client::Channel::getUserPrefix(pUVar6);
        if (cVar7 == '\0') {
          local_149 = ' ';
        }
        else {
          local_149 = Jupiter::IRC::Client::Channel::getUserPrefix(pUVar6);
        }
        lVar12 = Jupiter::IRC::Client::Channel::User::getPrefixes_abi_cxx11_();
        local_f0 = *(undefined8 *)(lVar12 + 8);
        puVar13 = (undefined8 *)Jupiter::IRC::Client::Channel::User::getPrefixes_abi_cxx11_();
        local_f8 = *puVar13;
        local_100 = puVar3;
        uVar14 = Jupiter::IRC::Client::Channel::getName();
        Jupiter::IRC::Client::Channel::getName();
        uVar15 = Jupiter::IRC::Client::User::getChannelCount();
        string_printf_abi_cxx11_
                  (&local_d0,
                   "User %.*s!%.*s@%.*s (prefix: %c; prefixes: %.*s) of channel %.*s (of %u shared)"
                   ,uVar11,uVar4,uVar5,local_d8,local_e0,local_e8,(ulong)(uint)(int)local_149,
                   local_f0,local_f8,uVar14,extraout_RDX_00,uVar15);
        Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar10,&local_d0,0);
        *(ResponseLine **)(local_148 + 0x28) = pRVar10;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          pRVar10 = *(ResponseLine **)(local_148 + 0x28);
        }
        pUVar6 = local_108;
        local_148 = pRVar10;
        puVar3 = (undefined8 *)*local_100;
      }
    }
  }
  return local_140;
}

Assistant:

Jupiter::GenericCommand::ResponseLine *DebugInfoGenericCommand::trigger(std::string_view parameters)
{
	IRC_Bot *server;
	if (IRCCommand::selected_server != nullptr)
		server = IRCCommand::selected_server;
	else if (IRCCommand::active_server != nullptr)
		server = IRCCommand::active_server;
	else
		return new Jupiter::GenericCommand::ResponseLine("Error: No IRC server is currently selected."sv, GenericCommand::DisplayType::PublicError);

	Jupiter::GenericCommand::ResponseLine *ret = new Jupiter::GenericCommand::ResponseLine("Prefixes: "s += server->getPrefixes(), GenericCommand::DisplayType::PublicSuccess);
	Jupiter::GenericCommand::ResponseLine *line = new Jupiter::GenericCommand::ResponseLine("Prefix Modes: "s += server->getPrefixModes(), GenericCommand::DisplayType::PublicSuccess);
	ret->next = line;
	line->next = new Jupiter::GenericCommand::ResponseLine(string_printf("Outputting data for %u channels...", server->getChannelCount()), GenericCommand::DisplayType::PublicSuccess);
	line = line->next;

	for (auto& channel_pair : server->getChannels()) {
		auto& channel = channel_pair.second;
		line->next = new Jupiter::GenericCommand::ResponseLine(string_printf("Channel %.*s - Type: %d", channel.getName().size(),
			channel.getName().data(), channel.getType()), GenericCommand::DisplayType::PublicSuccess);
		line = line->next;

		for (auto& user_pair : channel.getUsers()) {
			Jupiter::IRC::Client::User *user = user_pair.second->getUser();
			line->next = new Jupiter::GenericCommand::ResponseLine(string_printf("User %.*s!%.*s@%.*s (prefix: %c; prefixes: %.*s) of channel %.*s (of %u shared)",
				user->getNickname().size(), user->getNickname().data(),
				user->getUsername().size(), user->getUsername().data(),
				user->getHostname().size(), user->getHostname().data(),
				channel.getUserPrefix(*user_pair.second) ? channel.getUserPrefix(*user_pair.second) : ' ',
				user_pair.second->getPrefixes().size(), user_pair.second->getPrefixes().data(),
				channel.getName().size(), channel.getName().data(),
				user->getChannelCount()), GenericCommand::DisplayType::PublicSuccess);
			line = line->next;
		};
	};

	return ret;
}